

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O3

Extra_SymmInfo_t * Extra_SymmPairsCreateFromZdd(DdManager *dd,DdNode *zPairs,DdNode *bSupp)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  Extra_SymmInfo_t *pEVar6;
  void *__ptr;
  DdNode *pDVar7;
  DdNode *pDVar8;
  long lVar9;
  
  iVar5 = Extra_bddSuppSize(dd,bSupp);
  pEVar6 = Extra_SymmPairsAllocate(iVar5);
  iVar5 = dd->size;
  __ptr = calloc(1,(long)iVar5 << 2);
  pEVar6->nVarsMax = iVar5;
  pEVar6->nNodes = 0;
  pDVar7 = dd->one;
  if (pDVar7 != bSupp) {
    piVar3 = pEVar6->pVars;
    lVar9 = 0;
    do {
      uVar1 = bSupp->index;
      piVar3[lVar9] = uVar1;
      *(int *)((long)__ptr + (ulong)uVar1 * 4) = (int)lVar9;
      bSupp = (bSupp->type).kids.T;
      lVar9 = lVar9 + 1;
    } while (bSupp != pDVar7);
  }
  Cudd_Ref(zPairs);
  if (dd->zero == zPairs) {
    Cudd_RecursiveDerefZdd(dd,zPairs);
    if (__ptr == (void *)0x0) {
      return pEVar6;
    }
  }
  else {
    do {
      do {
        dd->reordered = 0;
        pDVar7 = extraZddSelectOneSubset(dd,zPairs);
      } while (dd->reordered == 1);
      Cudd_Ref(pDVar7);
      pDVar8 = (pDVar7->type).kids.T;
      if ((pDVar8->type).kids.T != dd->one) {
        __assert_fail("cuddT( cuddT(zCube) ) == z1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddSymm.c"
                      ,0x145,
                      "Extra_SymmInfo_t *Extra_SymmPairsCreateFromZdd(DdManager *, DdNode *, DdNode *)"
                     );
      }
      iVar5 = *(int *)((long)__ptr + (ulong)(pDVar7->index >> 1) * 4);
      iVar2 = *(int *)((long)__ptr + (ulong)(pDVar8->index >> 1) * 4);
      iVar4 = iVar2;
      if (iVar5 < iVar2) {
        iVar4 = iVar5;
      }
      if (iVar2 < iVar5) {
        iVar2 = iVar5;
      }
      pEVar6->pSymms[iVar4][iVar2] = '\x01';
      pEVar6->nSymms = pEVar6->nSymms + 1;
      pDVar8 = Cudd_zddDiff(dd,zPairs,pDVar7);
      Cudd_Ref(pDVar8);
      Cudd_RecursiveDerefZdd(dd,zPairs);
      Cudd_RecursiveDerefZdd(dd,pDVar7);
      zPairs = pDVar8;
    } while (pDVar8 != dd->zero);
    Cudd_RecursiveDerefZdd(dd,pDVar8);
  }
  free(__ptr);
  return pEVar6;
}

Assistant:

Extra_SymmInfo_t * Extra_SymmPairsCreateFromZdd( DdManager * dd, DdNode * zPairs, DdNode * bSupp )
{
    int i;
    int nSuppSize;
    Extra_SymmInfo_t * p;
    int * pMapVars2Nums;
    DdNode * bTemp;
    DdNode * zSet, * zCube, * zTemp;
    int iVar1, iVar2;

    nSuppSize = Extra_bddSuppSize( dd, bSupp );

    // allocate and clean the storage for symmetry info
    p = Extra_SymmPairsAllocate( nSuppSize );

    // allocate the storage for the temporary map
    pMapVars2Nums = ABC_ALLOC( int, dd->size );
    memset( pMapVars2Nums, 0, dd->size * sizeof(int) );

    // assign the variables
    p->nVarsMax = dd->size;
//  p->nNodes   = Cudd_DagSize( zPairs );
    p->nNodes   = 0;
    for ( i = 0, bTemp = bSupp; bTemp != b1; bTemp = cuddT(bTemp), i++ )
    {
        p->pVars[i] = bTemp->index;
        pMapVars2Nums[bTemp->index] = i;
    }

    // write the symmetry info into the structure
    zSet = zPairs;   Cudd_Ref( zSet );
    while ( zSet != z0 )
    {
        // get the next cube
        zCube  = Extra_zddSelectOneSubset( dd, zSet );    Cudd_Ref( zCube );

        // add these two variables to the data structure
        assert( cuddT( cuddT(zCube) ) == z1 );
        iVar1 = zCube->index/2;
        iVar2 = cuddT(zCube)->index/2;
        if ( pMapVars2Nums[iVar1] < pMapVars2Nums[iVar2] )
            p->pSymms[ pMapVars2Nums[iVar1] ][ pMapVars2Nums[iVar2] ] = 1;
        else
            p->pSymms[ pMapVars2Nums[iVar2] ][ pMapVars2Nums[iVar1] ] = 1;
        // count the symmetric pairs
        p->nSymms ++;

        // update the cuver and deref the cube
        zSet = Cudd_zddDiff( dd, zTemp = zSet, zCube );     Cudd_Ref( zSet );
        Cudd_RecursiveDerefZdd( dd, zTemp );
        Cudd_RecursiveDerefZdd( dd, zCube );

    } // for each cube 
    Cudd_RecursiveDerefZdd( dd, zSet );

    ABC_FREE( pMapVars2Nums );
    return p;

}